

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcolumnviewgrip_p.cpp
# Opt level: O2

void QColumnViewGrip::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_id == 0 && _c == InvokeMetaMethod) {
    gripMoved((QColumnViewGrip *)_o,*_a[1]);
  }
  if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QColumnViewGrip::*)(int)>
              ((QtMocHelpers *)_a,(void **)gripMoved,0,0);
    return;
  }
  return;
}

Assistant:

void QColumnViewGrip::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QColumnViewGrip *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->gripMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QColumnViewGrip::*)(int )>(_a, &QColumnViewGrip::gripMoved, 0))
            return;
    }
}